

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::MillenniumOperator>>
               (timestamp_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  idx_t iVar2;
  long lVar3;
  SelectionVector *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  long in_RSI;
  long in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  void *in_stack_ffffffffffffff98;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa0;
  ValidityMask *in_stack_ffffffffffffffa8;
  timestamp_t in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *pTVar4;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar1) {
    for (pTVar4 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar4 < in_RDX;
        pTVar4 = (TemplatedValidityMask<unsigned_long> *)
                 ((long)&((TemplatedValidityMask<unsigned_long> *)&pTVar4->validity_mask)->
                         validity_mask + 1)) {
      iVar2 = SelectionVector::get_index(in_RCX,(idx_t)pTVar4);
      lVar3 = GenericUnaryWrapper::
              Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::MillenniumOperator>,duckdb::timestamp_t,long>
                        (in_stack_ffffffffffffffb0,(ValidityMask *)pTVar4,iVar2,
                         *(void **)(in_RDI + iVar2 * 8));
      *(long *)(in_RSI + (long)pTVar4 * 8) = lVar3;
    }
  }
  else {
    for (pTVar4 = (TemplatedValidityMask<unsigned_long> *)0x0; pTVar4 < in_RDX;
        pTVar4 = (TemplatedValidityMask<unsigned_long> *)((long)&pTVar4->validity_mask + 1)) {
      iVar2 = SelectionVector::get_index(in_RCX,(idx_t)pTVar4);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe(pTVar4,iVar2);
      if (bVar1) {
        lVar3 = GenericUnaryWrapper::
                Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::MillenniumOperator>,duckdb::timestamp_t,long>
                          ((timestamp_t)*(int64_t *)(in_RDI + iVar2 * 8),in_stack_ffffffffffffffa8,
                           (idx_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        *(long *)(in_RSI + (long)pTVar4 * 8) = lVar3;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffffa0,(idx_t)in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}